

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::FileTimeCompare(string *f1,string *f2,int *result)

{
  int iVar1;
  Status SVar2;
  Status SVar3;
  stat s2;
  stat s1;
  stat local_130;
  stat local_a0;
  
  *result = 0;
  iVar1 = stat((f1->_M_dataplus)._M_p,&local_a0);
  if ((iVar1 != 0) || (iVar1 = stat((f2->_M_dataplus)._M_p,&local_130), iVar1 != 0)) {
    SVar2 = Status::POSIX_errno();
    return SVar2;
  }
  if (local_a0.st_mtim.tv_sec < local_130.st_mtim.tv_sec) {
LAB_0042c064:
    *result = -1;
  }
  else {
    if (local_a0.st_mtim.tv_sec <= local_130.st_mtim.tv_sec) {
      if (local_a0.st_mtim.tv_nsec < local_130.st_mtim.tv_nsec) goto LAB_0042c064;
      if (local_a0.st_mtim.tv_nsec <= local_130.st_mtim.tv_nsec) {
        SVar2.Kind_ = Success;
        SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
        return SVar2;
      }
    }
    *result = 1;
  }
  SVar3.Kind_ = Success;
  SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  return SVar3;
}

Assistant:

Status SystemTools::FileTimeCompare(std::string const& f1,
                                    std::string const& f2, int* result)
{
  // Default to same time.
  *result = 0;
#if !defined(_WIN32) || defined(__CYGWIN__)
  // POSIX version.  Use stat function to get file modification time.
  struct stat s1;
  if (stat(f1.c_str(), &s1) != 0) {
    return Status::POSIX_errno();
  }
  struct stat s2;
  if (stat(f2.c_str(), &s2) != 0) {
    return Status::POSIX_errno();
  }
#  if KWSYS_CXX_STAT_HAS_ST_MTIM
  // Compare using nanosecond resolution.
  if (s1.st_mtim.tv_sec < s2.st_mtim.tv_sec) {
    *result = -1;
  } else if (s1.st_mtim.tv_sec > s2.st_mtim.tv_sec) {
    *result = 1;
  } else if (s1.st_mtim.tv_nsec < s2.st_mtim.tv_nsec) {
    *result = -1;
  } else if (s1.st_mtim.tv_nsec > s2.st_mtim.tv_nsec) {
    *result = 1;
  }
#  elif KWSYS_CXX_STAT_HAS_ST_MTIMESPEC
  // Compare using nanosecond resolution.
  if (s1.st_mtimespec.tv_sec < s2.st_mtimespec.tv_sec) {
    *result = -1;
  } else if (s1.st_mtimespec.tv_sec > s2.st_mtimespec.tv_sec) {
    *result = 1;
  } else if (s1.st_mtimespec.tv_nsec < s2.st_mtimespec.tv_nsec) {
    *result = -1;
  } else if (s1.st_mtimespec.tv_nsec > s2.st_mtimespec.tv_nsec) {
    *result = 1;
  }
#  else
  // Compare using 1 second resolution.
  if (s1.st_mtime < s2.st_mtime) {
    *result = -1;
  } else if (s1.st_mtime > s2.st_mtime) {
    *result = 1;
  }
#  endif
#else
  // Windows version.  Get the modification time from extended file attributes.
  WIN32_FILE_ATTRIBUTE_DATA f1d;
  WIN32_FILE_ATTRIBUTE_DATA f2d;
  if (!GetFileAttributesExW(Encoding::ToWindowsExtendedPath(f1).c_str(),
                            GetFileExInfoStandard, &f1d)) {
    return Status::Windows_GetLastError();
  }
  if (!GetFileAttributesExW(Encoding::ToWindowsExtendedPath(f2).c_str(),
                            GetFileExInfoStandard, &f2d)) {
    return Status::Windows_GetLastError();
  }

  // Compare the file times using resolution provided by system call.
  *result = (int)CompareFileTime(&f1d.ftLastWriteTime, &f2d.ftLastWriteTime);
#endif
  return Status::Success();
}